

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void shuffle_uint32(uint32_t *storage,uint32_t size)

{
  undefined4 uVar1;
  uint32_t uVar2;
  uint in_ESI;
  long in_RDI;
  uint32_t val;
  uint32_t tmp;
  uint32_t nextpos;
  uint32_t i;
  
  for (; 1 < in_ESI; in_ESI = in_ESI - 1) {
    uVar2 = ranged_random(in_ESI);
    uVar1 = *(undefined4 *)(in_RDI + (ulong)(in_ESI - 1) * 4);
    *(undefined4 *)(in_RDI + (ulong)(in_ESI - 1) * 4) = *(undefined4 *)(in_RDI + (ulong)uVar2 * 4);
    *(undefined4 *)(in_RDI + (ulong)uVar2 * 4) = uVar1;
  }
  return;
}

Assistant:

static inline void shuffle_uint32(uint32_t *storage, uint32_t size) {
    uint32_t i;
    for (i = size; i > 1; i--) {
        uint32_t nextpos = ranged_random(i);
        uint32_t tmp = storage[i - 1];    // likely in cache
        uint32_t val = storage[nextpos];  // could be costly
        storage[i - 1] = val;
        storage[nextpos] = tmp;  // you might have to read this store later
    }
}